

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_all_apis.cpp
# Opt level: O0

void __thiscall APITests::add_tests(APITests *this)

{
  bool bVar1;
  TestFunction *in_stack_ffffffffffffe598;
  TestFunction *in_stack_ffffffffffffe5a0;
  TestFunction *this_00;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffe5a8;
  allocator *__f;
  function<void_()> *in_stack_ffffffffffffe5b0;
  function<void_()> *this_01;
  string *in_stack_ffffffffffffe5b8;
  allocator *name;
  TestFunction *in_stack_ffffffffffffe5c0;
  TestFunction *this_02;
  undefined1 local_17b0 [40];
  string local_1788 [104];
  function<void_()> local_1720;
  allocator local_16f9;
  string local_16f8 [104];
  undefined1 local_1690 [40];
  string local_1668 [143];
  allocator local_15d9;
  string local_15d8 [143];
  allocator local_1549;
  string local_1548 [143];
  allocator local_14b9;
  string local_14b8 [143];
  allocator local_1429;
  string local_1428 [143];
  allocator local_1399;
  string local_1398 [143];
  allocator local_1309;
  string local_1308 [143];
  allocator local_1279;
  string local_1278 [143];
  allocator local_11e9;
  string local_11e8 [143];
  allocator local_1159;
  string local_1158 [143];
  allocator local_10c9;
  string local_10c8 [143];
  allocator local_1039;
  string local_1038 [143];
  allocator local_fa9;
  string local_fa8 [143];
  allocator local_f19;
  string local_f18 [143];
  allocator local_e89;
  string local_e88 [143];
  allocator local_df9;
  string local_df8 [143];
  allocator local_d69;
  string local_d68 [143];
  allocator local_cd9;
  string local_cd8 [143];
  allocator local_c49;
  string local_c48 [143];
  allocator local_bb9;
  string local_bb8 [143];
  allocator local_b29;
  string local_b28 [143];
  allocator local_a99;
  string local_a98 [143];
  allocator local_a09;
  string local_a08 [143];
  allocator local_979;
  string local_978 [143];
  allocator local_8e9;
  string local_8e8 [143];
  allocator local_859;
  string local_858 [143];
  allocator local_7c9;
  string local_7c8 [143];
  allocator local_739;
  string local_738 [143];
  allocator local_6a9;
  string local_6a8 [143];
  allocator local_619;
  string local_618 [143];
  allocator local_589;
  string local_588 [143];
  allocator local_4f9;
  string local_4f8 [143];
  allocator local_469;
  string local_468 [143];
  allocator local_3d9;
  string local_3d8 [143];
  allocator local_349;
  string local_348 [143];
  allocator local_2b9;
  string local_2b8 [143];
  allocator local_229;
  string local_228 [143];
  allocator local_199;
  string local_198 [143];
  allocator local_109;
  string local_108 [159];
  allocator local_69;
  string local_68 [104];
  
  TestSuit::reserve((TestSuit *)in_stack_ffffffffffffe5a0,(size_t)in_stack_ffffffffffffe598);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"test_warnings_off",&local_69);
  std::function<void()>::function<APITests::add_tests()::_lambda()_1_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x133d49);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"test_warnings_on",&local_109);
  std::function<void()>::function<APITests::add_tests()::_lambda()_2_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x133e13);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"test_cleanup_multiple_channels",&local_199);
  std::function<void()>::function<APITests::add_tests()::_lambda()_3_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x133edd);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"test_cleanup_multiple_channels_in_vector",&local_229);
  std::function<void()>::function<APITests::add_tests()::_lambda()_4_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x133fa7);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2b8,"test_setup_one_board",&local_2b9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_5_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134071);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_348,"test_setup_one_bcm",&local_349);
  std::function<void()>::function<APITests::add_tests()::_lambda()_6_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x13413b);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator((allocator<char> *)&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d8,"test_setup_one_cvm",&local_3d9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_7_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134205);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_468,"test_setup_one_tegra_soc",&local_469);
  std::function<void()>::function<APITests::add_tests()::_lambda()_8_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1342cf);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::~allocator((allocator<char> *)&local_469);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"test_setup_twice",&local_4f9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_9_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134399);
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_588,"test_setup_one_out_no_init",&local_589);
  std::function<void()>::function<APITests::add_tests()::_lambda()_10_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134463);
  std::__cxx11::string::~string(local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_618,"test_setup_one_out_high",&local_619);
  std::function<void()>::function<APITests::add_tests()::_lambda()_11_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x13452d);
  std::__cxx11::string::~string(local_618);
  std::allocator<char>::~allocator((allocator<char> *)&local_619);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6a8,"test_setup_one_out_low",&local_6a9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_12_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1345f7);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"test_setup_one_in",&local_739);
  std::function<void()>::function<APITests::add_tests()::_lambda()_13_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1346c1);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7c8,"test_setup_all0",&local_7c9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_14_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x13478b);
  std::__cxx11::string::~string(local_7c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_858,"test_setup_all1",&local_859);
  std::function<void()>::function<APITests::add_tests()::_lambda()_15_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134855);
  std::__cxx11::string::~string(local_858);
  std::allocator<char>::~allocator((allocator<char> *)&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8e8,"test_setup_multiple_outputs0",&local_8e9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_16_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x13491f);
  std::__cxx11::string::~string(local_8e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_978,"test_setup_multiple_outputs1",&local_979);
  std::function<void()>::function<APITests::add_tests()::_lambda()_17_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1349e9);
  std::__cxx11::string::~string(local_978);
  std::allocator<char>::~allocator((allocator<char> *)&local_979);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a08,"test_setup_multiple_outputs2",&local_a09);
  std::function<void()>::function<APITests::add_tests()::_lambda()_18_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134ab3);
  std::__cxx11::string::~string(local_a08);
  std::allocator<char>::~allocator((allocator<char> *)&local_a09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a98,"test_cleanup_one",&local_a99);
  std::function<void()>::function<APITests::add_tests()::_lambda()_19_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134b7d);
  std::__cxx11::string::~string(local_a98);
  std::allocator<char>::~allocator((allocator<char> *)&local_a99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b28,"test_cleanup_all",&local_b29);
  std::function<void()>::function<APITests::add_tests()::_lambda()_20_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134c47);
  std::__cxx11::string::~string(local_b28);
  std::allocator<char>::~allocator((allocator<char> *)&local_b29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bb8,"test_input",&local_bb9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_21_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134d11);
  std::__cxx11::string::~string(local_bb8);
  std::allocator<char>::~allocator((allocator<char> *)&local_bb9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c48,"test_output_one",&local_c49);
  std::function<void()>::function<APITests::add_tests()::_lambda()_22_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134ddb);
  std::__cxx11::string::~string(local_c48);
  std::allocator<char>::~allocator((allocator<char> *)&local_c49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_cd8,"test_multiple_outputs0",&local_cd9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_23_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134ea5);
  std::__cxx11::string::~string(local_cd8);
  std::allocator<char>::~allocator((allocator<char> *)&local_cd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d68,"test_multiple_outputs1",&local_d69);
  std::function<void()>::function<APITests::add_tests()::_lambda()_24_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x134f6f);
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_df8,"test_out_in_init_high",&local_df9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_25_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135039);
  std::__cxx11::string::~string(local_df8);
  std::allocator<char>::~allocator((allocator<char> *)&local_df9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e88,"test_out_in_init_low",&local_e89);
  std::function<void()>::function<APITests::add_tests()::_lambda()_26_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135103);
  std::__cxx11::string::~string(local_e88);
  std::allocator<char>::~allocator((allocator<char> *)&local_e89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f18,"test_gpio_function_unexported",&local_f19);
  std::function<void()>::function<APITests::add_tests()::_lambda()_27_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1351cd);
  std::__cxx11::string::~string(local_f18);
  std::allocator<char>::~allocator((allocator<char> *)&local_f19);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_fa8,"test_gpio_function_in",&local_fa9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_28_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135297);
  std::__cxx11::string::~string(local_fa8);
  std::allocator<char>::~allocator((allocator<char> *)&local_fa9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1038,"test_gpio_function_out",&local_1039);
  std::function<void()>::function<APITests::add_tests()::_lambda()_29_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135361);
  std::__cxx11::string::~string(local_1038);
  std::allocator<char>::~allocator((allocator<char> *)&local_1039);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_10c8,"test_wait_for_edge_rising",&local_10c9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_30_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x13542b);
  std::__cxx11::string::~string(local_10c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1158,"test_wait_for_edge_falling",&local_1159);
  std::function<void()>::function<APITests::add_tests()::_lambda()_31_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1354f5);
  std::__cxx11::string::~string(local_1158);
  std::allocator<char>::~allocator((allocator<char> *)&local_1159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_11e8,"test_event_detected_rising",&local_11e9);
  std::function<void()>::function<APITests::add_tests()::_lambda()_32_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x1355bf);
  std::__cxx11::string::~string(local_11e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_11e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1278,"test_event_detected_falling",&local_1279);
  std::function<void()>::function<APITests::add_tests()::_lambda()_33_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135689);
  std::__cxx11::string::~string(local_1278);
  std::allocator<char>::~allocator((allocator<char> *)&local_1279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1308,"test_event_detected_both",&local_1309);
  std::function<void()>::function<APITests::add_tests()::_lambda()_34_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135753);
  std::__cxx11::string::~string(local_1308);
  std::allocator<char>::~allocator((allocator<char> *)&local_1309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1398,"test_add_callback_before_add_event_detect",&local_1399);
  std::function<void()>::function<APITests::add_tests()::_lambda()_35_,void>
            (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
  TestFunction::TestFunction
            (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
  TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
  TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
  std::function<void_()>::~function((function<void_()> *)0x135817);
  std::__cxx11::string::~string(local_1398);
  std::allocator<char>::~allocator((allocator<char> *)&local_1399);
  bVar1 = std::vector<int,_std::allocator<int>_>::empty
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe5b0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1428,"test_pwm_multi_duty",&local_1429);
    std::function<void()>::function<APITests::add_tests()::_lambda()_36_,void>
              (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction
              (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x1358f2);
    std::__cxx11::string::~string(local_1428);
    std::allocator<char>::~allocator((allocator<char> *)&local_1429);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_14b8,"test_pwm_change_frequency",&local_14b9);
    std::function<void()>::function<APITests::add_tests()::_lambda()_37_,void>
              (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction
              (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x1359b0);
    std::__cxx11::string::~string(local_14b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_14b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1548,"test_pwm_change_duty_cycle",&local_1549);
    std::function<void()>::function<APITests::add_tests()::_lambda()_38_,void>
              (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction
              (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x135a6e);
    std::__cxx11::string::~string(local_1548);
    std::allocator<char>::~allocator((allocator<char> *)&local_1549);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_15d8,"test_pwm_cleanup_none",&local_15d9);
    std::function<void()>::function<APITests::add_tests()::_lambda()_39_,void>
              (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction
              (in_stack_ffffffffffffe5c0,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x135b2c);
    std::__cxx11::string::~string(local_15d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_15d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_1668,"test_pwm_cleanup_stop",(allocator *)(local_1690 + 0x27));
    this_02 = (TestFunction *)local_1690;
    std::function<void()>::function<APITests::add_tests()::_lambda()_40_,void>
              (in_stack_ffffffffffffe5b0,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction(this_02,in_stack_ffffffffffffe5b8,in_stack_ffffffffffffe5b0);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x135bea);
    std::__cxx11::string::~string(local_1668);
    std::allocator<char>::~allocator((allocator<char> *)(local_1690 + 0x27));
    name = &local_16f9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_16f8,"test_pwm_cleanup_del",name);
    this_01 = &local_1720;
    std::function<void()>::function<APITests::add_tests()::_lambda()_41_,void>
              (this_01,in_stack_ffffffffffffe5a8);
    TestFunction::TestFunction(this_02,(string *)name,this_01);
    TestSuit::add((TestSuit *)in_stack_ffffffffffffe5a0,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(in_stack_ffffffffffffe5a0);
    std::function<void_()>::~function((function<void_()> *)0x135ca8);
    std::__cxx11::string::~string(local_16f8);
    std::allocator<char>::~allocator((allocator<char> *)&local_16f9);
    __f = (allocator *)(local_17b0 + 0x27);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1788,"test_pwm_create_all",__f);
    this_00 = (TestFunction *)local_17b0;
    std::function<void()>::function<APITests::add_tests()::_lambda()_42_,void>
              (this_01,(anon_class_8_1_8991fb9c *)__f);
    TestFunction::TestFunction(this_02,(string *)name,this_01);
    TestSuit::add((TestSuit *)this_00,in_stack_ffffffffffffe598);
    TestFunction::~TestFunction(this_00);
    std::function<void_()>::~function((function<void_()> *)0x135d66);
    std::__cxx11::string::~string(local_1788);
    std::allocator<char>::~allocator((allocator<char> *)(local_17b0 + 0x27));
  }
  return;
}

Assistant:

void add_tests()
    {
        reserve(100);
#define ADD_TEST(NAME) add({#NAME, [this]() { NAME(); }})

        ADD_TEST(test_warnings_off);
        ADD_TEST(test_warnings_on);
        ADD_TEST(test_cleanup_multiple_channels);
        ADD_TEST(test_cleanup_multiple_channels_in_vector);
        ADD_TEST(test_setup_one_board);
        ADD_TEST(test_setup_one_bcm);
        ADD_TEST(test_setup_one_cvm);
        ADD_TEST(test_setup_one_tegra_soc);
        ADD_TEST(test_setup_twice);
        ADD_TEST(test_setup_one_out_no_init);
        ADD_TEST(test_setup_one_out_high);
        ADD_TEST(test_setup_one_out_low);
        ADD_TEST(test_setup_one_in);
        ADD_TEST(test_setup_all0);
        ADD_TEST(test_setup_all1);
        ADD_TEST(test_setup_multiple_outputs0);
        ADD_TEST(test_setup_multiple_outputs1);
        ADD_TEST(test_setup_multiple_outputs2);
        ADD_TEST(test_cleanup_one);
        ADD_TEST(test_cleanup_all);
        ADD_TEST(test_input);
        ADD_TEST(test_output_one);
        ADD_TEST(test_multiple_outputs0);
        ADD_TEST(test_multiple_outputs1);
        ADD_TEST(test_out_in_init_high);
        ADD_TEST(test_out_in_init_low);
        ADD_TEST(test_gpio_function_unexported);
        ADD_TEST(test_gpio_function_in);
        ADD_TEST(test_gpio_function_out);

        // event
        ADD_TEST(test_wait_for_edge_rising);
        ADD_TEST(test_wait_for_edge_falling);
        ADD_TEST(test_event_detected_rising);
        ADD_TEST(test_event_detected_falling);
        ADD_TEST(test_event_detected_both);
        ADD_TEST(test_add_callback_before_add_event_detect);

        // pwm
        if (!pin_data.all_pwms.empty())
        {
            ADD_TEST(test_pwm_multi_duty);
            ADD_TEST(test_pwm_change_frequency);
            ADD_TEST(test_pwm_change_duty_cycle);
            ADD_TEST(test_pwm_cleanup_none);
            ADD_TEST(test_pwm_cleanup_stop);
            ADD_TEST(test_pwm_cleanup_del);
            ADD_TEST(test_pwm_create_all);
        }

#undef ADD_TEST
    }